

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_hashmap_walk(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  undefined8 *puVar1;
  jx9_hashmap_node *pNode;
  jx9_vm *pjVar2;
  sxi32 sVar3;
  jx9_value *pResult;
  long lVar4;
  jx9_hashmap_node **ppjVar5;
  uint uVar6;
  jx9_real jVar7;
  jx9_value sKey;
  jx9_value *local_80;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((nArg < 2) || (((*apArg)->iFlags & 0x40) == 0)) {
    jVar7 = 0.0;
  }
  else {
    if (nArg == 2) {
      local_80 = (jx9_value *)0x0;
    }
    else {
      local_80 = apArg[2];
    }
    puVar1 = (undefined8 *)((*apArg)->x).pOther;
    local_68 = *puVar1;
    uStack_40 = 0;
    local_78.rVal = 0.0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_70 = 0x20;
    jVar7 = 4.94065645841247e-324;
    uStack_60 = local_68;
    if (*(int *)((long)puVar1 + 0x2c) != 0) {
      ppjVar5 = (jx9_hashmap_node **)(puVar1 + 2);
      uVar6 = 0;
      do {
        pNode = *ppjVar5;
        pjVar2 = pNode->pMap->pVm;
        if (pNode->nValIdx < (pjVar2->aMemObj).nUsed) {
          lVar4 = (ulong)(pNode->nValIdx * (pjVar2->aMemObj).eSize) + (long)(pjVar2->aMemObj).pBase;
        }
        else {
          lVar4 = 0;
        }
        if (lVar4 != 0) {
          jx9HashmapExtractNodeKey(pNode,(jx9_value *)&local_78);
          sVar3 = jx9VmCallUserFunctionAp
                            ((jx9_vm *)*puVar1,apArg[1],pResult,lVar4,&local_78,local_80,0);
          jx9MemObjRelease((jx9_value *)&local_78);
          if (sVar3 != 0) {
            jVar7 = 0.0;
            goto LAB_0013963b;
          }
        }
        ppjVar5 = &pNode->pPrev;
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(uint *)((long)puVar1 + 0x2c));
      jVar7 = 4.94065645841247e-324;
    }
  }
LAB_0013963b:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar7;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9_hashmap_walk(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pUserData, sKey;
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pMap;
	sxi32 rc;
	sxu32 n;
	if( nArg < 2 || !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid/Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pUserData = nArg > 2 ? apArg[2] : 0;
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	jx9MemObjInit(pMap->pVm, &sKey);
	/* Perform the desired operation */
	pEntry = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extract the node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			/* Extract the entry key */
			jx9HashmapExtractNodeKey(pEntry, &sKey);
			/* Invoke the supplied callback */
			rc = jx9VmCallUserFunctionAp(pMap->pVm, apArg[1], 0, pValue, &sKey, pUserData, 0);
			jx9MemObjRelease(&sKey);
			if( rc != SXRET_OK ){
				/* An error occured while invoking the supplied callback [i.e: not defined] */
				jx9_result_bool(pCtx, 0); /* return FALSE */
				return JX9_OK;
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}